

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

void __thiscall cmCTestBZR::LogParser::~LogParser(LogParser *this)

{
  ~LogParser(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

~LogParser() { this->CleanupParser(); }